

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::Detach(ConsumerEndpointImpl *this,string *key)

{
  element_type *ppCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  TaskRunner *pTVar2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  
  bVar3 = DetachConsumer(this->service_,this,key);
  ppCVar1 = (this->weak_ptr_factory_).weak_ptr_.handle_.
            super___shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  this_00 = (this->weak_ptr_factory_).weak_ptr_.handle_.
            super___shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  pTVar2 = this->task_runner_;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48 = (undefined8 *)0x0;
  uStack_40 = 0;
  local_48 = (undefined8 *)operator_new(0x18);
  *local_48 = ppCVar1;
  local_48[1] = this_00;
  *(bool *)(local_48 + 2) = bVar3;
  pcStack_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:59615:26)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:59615:26)>
             ::_M_manager;
  (*pTVar2->_vptr_TaskRunner[2])(pTVar2);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::Detach(const std::string& key) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  bool success = service_->DetachConsumer(this, key);
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, success] {
    if (weak_this)
      weak_this->consumer_->OnDetach(success);
  });
}